

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

LinkedList<int> * __thiscall LinkedList<int>::operator=(LinkedList<int> *this,LinkedList<int> *copy)

{
  Node<int> *pNVar1;
  code *pcVar2;
  Node<int> *__s;
  Node<int> *node;
  Node<int> *currNext_1;
  Node<int> *currNext;
  Node<int> *curr;
  LinkedList<int> *copy_local;
  LinkedList<int> *this_local;
  
  this->size = copy->size;
  pNVar1 = this->head;
  while (currNext = pNVar1, currNext != (Node<int> *)0x0) {
    pNVar1 = currNext->next;
    if (currNext != (Node<int> *)0x0) {
      operator_delete(currNext,0x10);
    }
  }
  currNext = copy->head;
  while (currNext != (Node<int> *)0x0) {
    pNVar1 = currNext->next;
    __s = (Node<int> *)operator_new(0x10);
    memset(__s,0,0x10);
    __s->data = currNext->data;
    __s->next = (Node<int> *)0x0;
    currNext = pNVar1;
    if (this->head == (Node<int> *)0x0) {
      this->head = __s;
      this->tail = __s;
    }
    else {
      this->tail->next = __s;
      this->tail = __s;
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

LinkedList<T>& LinkedList<T>::operator=(const LinkedList &copy)
{
    auto curr = head;
    size = copy.size;

    while(curr != nullptr)
    {
        auto currNext = curr->next;
        delete curr;
        curr = currNext;
    }

    curr = copy.head;
    while(curr != nullptr)
    {
        auto currNext = curr->next;
        auto *node = new Node<T>();
        node->data = curr->data;
        node->next = nullptr;

        if(head == nullptr)
        {
            head = node;
            tail = node;
        } else
        {
            tail->next = node;
            tail = node;
        }
        curr = currNext;
    }
}